

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

bool __thiscall slang::ast::Scope::handleDataDeclaration(Scope *this,DataDeclarationSyntax *syntax)

{
  Token *this_00;
  DeferredMemberIndex DVar1;
  SymbolKind SVar2;
  NamedTypeSyntax *syntax_00;
  DeclaratorSyntax *decl;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  bool bVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  NetSymbol *this_01;
  DeferredMemberData *pDVar5;
  long lVar6;
  Scope *pSVar7;
  bitmask<slang::ast::LookupFlags> in_R8D;
  ulong uVar8;
  string_view lookupName;
  SourceRange sourceRange;
  string_view name;
  SourceLocation local_60;
  NetType *local_58;
  Compilation *local_50;
  DefinitionLookupResult local_48;
  
  syntax_00 = (NamedTypeSyntax *)(syntax->type).ptr;
  lookupName = getIdentifierName(syntax_00);
  name._M_len = lookupName._M_str;
  if ((Scope *)lookupName._M_len != (Scope *)0x0) {
    DVar1 = this->deferredMemberIndex;
    this->deferredMemberIndex = Invalid;
    name._M_str = (char *)0x0;
    local_58 = (NetType *)Lookup::unqualified((Lookup *)this,(Scope *)lookupName._M_len,name,in_R8D)
    ;
    this->deferredMemberIndex = DVar1;
    if (local_58 == (NetType *)0x0) {
      if ((((syntax_00->name).ptr)->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName)
      {
        Compilation::tryGetDefinition(&local_48,this->compilation,lookupName,this);
        if ((local_48.definition != (Symbol *)0x0) && ((local_48.definition)->kind == Definition)) {
          if (((int)local_48.definition[1].name._M_len == 1) &&
             ((this->thisSym->kind == InstanceBody &&
              (this->thisSym[2].name._M_str[0x2d8] == '\x01')))) {
            addDeferredMembers(this,(SyntaxNode *)syntax);
            pDVar5 = Compilation::getOrAddDeferredData(this->compilation,&this->deferredMemberIndex)
            ;
            local_48.definition = this->lastMember;
            local_60 = (SourceLocation)syntax;
            std::
            vector<std::pair<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*>>>
            ::emplace_back<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*&>
                      ((vector<std::pair<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::ast::Symbol_const*>>>
                        *)&pDVar5->portDecls,(SyntaxNode **)&local_60,(Symbol **)&local_48);
          }
          else {
            uVar8 = (syntax->declarators).elements._M_extent._M_extent_value + 1;
            if (1 < uVar8) {
              uVar8 = uVar8 >> 1;
              lVar6 = 0;
              do {
                ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                    ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      *)((long)&(((syntax->declarators).elements._M_ptr)->
                                                super_ConstTokenOrSyntax).
                                                super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                                .
                                                super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                                .
                                                super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                                .
                                                super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                                .
                                                super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                        + lVar6));
                if (*(long *)(*ppSVar4 + 4) != 0) {
                  return false;
                }
                lVar6 = lVar6 + 0x30;
                uVar8 = uVar8 - 1;
              } while (uVar8 != 0);
            }
            addDeferredMembers(this,(SyntaxNode *)syntax);
          }
          return true;
        }
      }
    }
    else if ((local_58->super_Symbol).kind == NetType) {
      uVar8 = (syntax->declarators).elements._M_extent._M_extent_value + 1;
      pSVar7 = this;
      if (1 < uVar8) {
        uVar8 = uVar8 >> 1;
        lVar6 = 0;
        do {
          ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                              ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                               ((long)&(((syntax->declarators).elements._M_ptr)->
                                       super_ConstTokenOrSyntax).
                                       super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                               + lVar6));
          decl = (DeclaratorSyntax *)*ppSVar4;
          local_50 = this->compilation;
          this_00 = &decl->name;
          local_48._0_16_ = parsing::Token::valueText(this_00);
          local_60 = parsing::Token::location(this_00);
          this_01 = BumpAllocator::
                    emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&>
                              (&local_50->super_BumpAllocator,
                               (basic_string_view<char,_std::char_traits<char>_> *)&local_48,
                               &local_60,local_58);
          ValueSymbol::setFromDeclarator(&this_01->super_ValueSymbol,decl);
          syntax_01._M_ptr =
               (syntax->super_MemberSyntax).attributes.
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
          syntax_01._M_extent._M_extent_value =
               (syntax->super_MemberSyntax).attributes.
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
               _M_extent._M_extent_value;
          Symbol::setAttributes((Symbol *)this_01,this,syntax_01);
          insertMember(this,(Symbol *)this_01,this->lastMember,false,true);
          lVar6 = lVar6 + 0x30;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      do {
        SVar2 = pSVar7->thisSym->kind;
        if (SVar2 == InstanceBody) {
LAB_0033b251:
          bVar3 = true;
        }
        else {
          if (SVar2 == CheckerInstanceBody) {
            sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
            addDiag(this,(DiagCode)0x890005,sourceRange);
            goto LAB_0033b251;
          }
          pSVar7 = pSVar7->thisSym->parentScope;
          bVar3 = false;
        }
        if (bVar3) {
          return true;
        }
        if (pSVar7 == (Scope *)0x0) {
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool Scope::handleDataDeclaration(const DataDeclarationSyntax& syntax) {
    auto& namedType = syntax.type->as<NamedTypeSyntax>();
    std::string_view name = getIdentifierName(namedType);
    if (name.empty())
        return false;

    // We aren't elaborated yet so can't do a normal lookup in this scope.
    // Temporarily swap out the deferred member index so that the lookup
    // doesn't trigger elaboration.
    auto savedIndex = std::exchange(deferredMemberIndex, DeferredMemberIndex::Invalid);
    auto symbol = Lookup::unqualified(*this, name);
    deferredMemberIndex = savedIndex;

    // If we found a net type, this is actually one or more net symbols.
    if (symbol && symbol->kind == SymbolKind::NetType) {
        auto& netType = symbol->as<NetType>();
        for (auto decl : syntax.declarators) {
            auto net = compilation.emplace<NetSymbol>(decl->name.valueText(), decl->name.location(),
                                                      netType);
            net->setFromDeclarator(*decl);
            net->setAttributes(*this, syntax.attributes);
            addMember(*net);
        }

        // Make sure we're not declared within a checker.
        const Scope* currScope = this;
        do {
            auto& sym = currScope->asSymbol();
            if (sym.kind == SymbolKind::InstanceBody)
                break;

            if (sym.kind == SymbolKind::CheckerInstanceBody) {
                addDiag(diag::NotAllowedInChecker, syntax.sourceRange());
                break;
            }

            currScope = sym.getParentScope();
        } while (currScope);

        return true;
    }

    // No user-defined net type found. If this is a simple name and no symbol at all
    // was found we should continue on to see if this is a non-ansi interface port.
    if (symbol || namedType.name->kind != SyntaxKind::IdentifierName)
        return false;

    auto def = compilation.tryGetDefinition(name, *this).definition;
    if (!def || def->kind != SymbolKind::Definition)
        return false;

    // If we're in an instance and have non-ansi ports then assume that this is
    // a non-ansi interface port definition.
    if (def->as<DefinitionSymbol>().definitionKind == DefinitionKind::Interface &&
        asSymbol().kind == SymbolKind::InstanceBody &&
        asSymbol().as<InstanceBodySymbol>().getDefinition().hasNonAnsiPorts) {

        // Save for later when we process the ports.
        addDeferredMembers(syntax);
        getOrAddDeferredData().addPortDeclaration(syntax, lastMember);
        return true;
    }

    // If we made it this far it's probably a malformed instantiation -- the user forgot
    // to include the parentheses. Let's just treat it like an instantiation instead, as
    // long as there are no decl initializers (which would never look like an instantiation).
    for (auto decl : syntax.declarators) {
        if (decl->initializer)
            return false;
    }

    addDeferredMembers(syntax);
    return true;
}